

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O1

void IntraChromaPreds_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  ulong *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  byte bVar7;
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  unkuint9 Var19;
  undefined1 auVar20 [11];
  undefined1 auVar21 [13];
  undefined1 auVar22 [15];
  undefined1 auVar23 [11];
  undefined1 auVar24 [13];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  int j_3;
  uint uVar29;
  uint uVar30;
  long lVar31;
  uint8_t *puVar32;
  ulong *puVar33;
  int j;
  int j_2;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  short sVar46;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  undefined1 auVar47 [16];
  short sVar55;
  undefined1 auVar48 [16];
  undefined1 uVar44;
  undefined1 uVar45;
  
  if (top == (uint8_t *)0x0) {
    if (left == (uint8_t *)0x0) {
      lVar31 = 0;
      do {
        puVar32 = dst + lVar31 + 0x400;
        puVar32[0] = 0x80;
        puVar32[1] = 0x80;
        puVar32[2] = 0x80;
        puVar32[3] = 0x80;
        puVar32[4] = 0x80;
        puVar32[5] = 0x80;
        puVar32[6] = 0x80;
        puVar32[7] = 0x80;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
    else {
      auVar47._8_8_ = 0;
      auVar47._0_8_ = *(ulong *)left;
      auVar47 = psadbw((undefined1  [16])0x0,auVar47);
      uVar29 = auVar47._0_4_ + 4;
      uVar30 = uVar29 >> 3;
      bVar7 = (byte)(uVar29 >> 0x18);
      uVar45 = (undefined1)(uVar30 >> 0x10);
      uVar44 = (undefined1)(uVar30 >> 8);
      auVar37._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(bVar7 >> 3,bVar7 >> 3),uVar45),CONCAT14(uVar45,uVar30))
                >> 0x20);
      auVar37[3] = uVar44;
      auVar37[2] = uVar44;
      auVar37[0] = (undefined1)uVar30;
      auVar37[1] = auVar37[0];
      auVar37._8_8_ = 0;
      auVar47 = pshuflw(auVar37,auVar37,0);
      lVar31 = 0;
      do {
        *(long *)(dst + lVar31 + 0x400) = auVar47._0_8_;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
  }
  else {
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *(ulong *)top;
    if (left == (uint8_t *)0x0) {
      auVar47 = psadbw(auVar34,(undefined1  [16])0x0);
      uVar29 = auVar47._0_4_ + 4;
      uVar30 = uVar29 >> 3;
      bVar7 = (byte)(uVar29 >> 0x18);
      uVar45 = (undefined1)(uVar30 >> 0x10);
      uVar44 = (undefined1)(uVar30 >> 8);
      auVar38._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(bVar7 >> 3,bVar7 >> 3),uVar45),CONCAT14(uVar45,uVar30))
                >> 0x20);
      auVar38[3] = uVar44;
      auVar38[2] = uVar44;
      auVar38[0] = (undefined1)uVar30;
      auVar38[1] = auVar38[0];
      auVar38._8_8_ = 0;
      auVar47 = pshuflw(auVar38,auVar38,0);
      lVar31 = 0;
      do {
        *(long *)(dst + lVar31 + 0x400) = auVar47._0_8_;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
    else {
      auVar35._8_8_ = *(undefined8 *)left;
      auVar35._0_8_ = *(ulong *)top;
      auVar47 = psadbw((undefined1  [16])0x0,auVar35);
      uVar29 = auVar47._8_4_ + auVar47._0_4_ + 8;
      uVar30 = uVar29 >> 4;
      bVar7 = (byte)(uVar29 >> 0x18);
      uVar45 = (undefined1)(uVar30 >> 0x10);
      uVar44 = (undefined1)(uVar30 >> 8);
      auVar36._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(bVar7 >> 4,bVar7 >> 4),uVar45),CONCAT14(uVar45,uVar30))
                >> 0x20);
      auVar36[3] = uVar44;
      auVar36[2] = uVar44;
      auVar36[0] = (undefined1)uVar30;
      auVar36[1] = auVar36[0];
      auVar36._8_8_ = 0;
      auVar47 = pshuflw(auVar36,auVar36,0);
      lVar31 = 0;
      do {
        *(long *)(dst + lVar31 + 0x400) = auVar47._0_8_;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
  }
  if (top == (uint8_t *)0x0) {
    lVar31 = 0;
    do {
      builtin_memcpy(dst + lVar31 + 0x500,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",8);
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  else {
    uVar4 = *(undefined8 *)top;
    lVar31 = 0;
    do {
      *(undefined8 *)(dst + lVar31 + 0x500) = uVar4;
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  puVar32 = dst + 0x510;
  lVar31 = 0;
  if (left == (uint8_t *)0x0) {
    do {
      puVar2 = puVar32 + lVar31;
      puVar2[0] = 0x81;
      puVar2[1] = 0x81;
      puVar2[2] = 0x81;
      puVar2[3] = 0x81;
      puVar2[4] = 0x81;
      puVar2[5] = 0x81;
      puVar2[6] = 0x81;
      puVar2[7] = 0x81;
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  else {
    do {
      auVar47 = ZEXT216(CONCAT11(left[lVar31],left[lVar31]));
      auVar47 = pshuflw(auVar47,auVar47,0);
      *(long *)puVar32 = auVar47._0_8_;
      puVar32 = puVar32 + 0x20;
      lVar31 = lVar31 + 1;
    } while (lVar31 != 8);
  }
  puVar32 = dst + 0x410;
  if (left == (uint8_t *)0x0) {
    if (top == (uint8_t *)0x0) {
      lVar31 = 0;
      do {
        puVar2 = puVar32 + lVar31;
        puVar2[0] = 0x81;
        puVar2[1] = 0x81;
        puVar2[2] = 0x81;
        puVar2[3] = 0x81;
        puVar2[4] = 0x81;
        puVar2[5] = 0x81;
        puVar2[6] = 0x81;
        puVar2[7] = 0x81;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
    else {
      uVar4 = *(undefined8 *)top;
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar32 + lVar31) = uVar4;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
  }
  else if (top == (uint8_t *)0x0) {
    lVar31 = 0;
    do {
      auVar47 = ZEXT216(CONCAT11(left[lVar31],left[lVar31]));
      auVar47 = pshuflw(auVar47,auVar47,0);
      *(long *)puVar32 = auVar47._0_8_;
      puVar32 = puVar32 + 0x20;
      lVar31 = lVar31 + 1;
    } while (lVar31 != 8);
  }
  else {
    uVar3 = *(ulong *)top;
    auVar5._8_6_ = 0;
    auVar5._0_8_ = uVar3;
    auVar5[0xe] = (char)(uVar3 >> 0x38);
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar3;
    auVar8[0xc] = (char)(uVar3 >> 0x30);
    auVar8._13_2_ = auVar5._13_2_;
    auVar10._8_4_ = 0;
    auVar10._0_8_ = uVar3;
    auVar10._12_3_ = auVar8._12_3_;
    auVar12._8_2_ = 0;
    auVar12._0_8_ = uVar3;
    auVar12[10] = (char)(uVar3 >> 0x28);
    auVar12._11_4_ = auVar10._11_4_;
    auVar14._8_2_ = 0;
    auVar14._0_8_ = uVar3;
    auVar14._10_5_ = auVar12._10_5_;
    auVar16[8] = (char)(uVar3 >> 0x20);
    auVar16._0_8_ = uVar3;
    auVar16._9_6_ = auVar14._9_6_;
    auVar18._7_8_ = 0;
    auVar18._0_7_ = auVar16._8_7_;
    Var19 = CONCAT81(SUB158(auVar18 << 0x40,7),(char)(uVar3 >> 0x18));
    auVar25._9_6_ = 0;
    auVar25._0_9_ = Var19;
    auVar20._1_10_ = SUB1510(auVar25 << 0x30,5);
    auVar20[0] = (char)(uVar3 >> 0x10);
    auVar26._11_4_ = 0;
    auVar26._0_11_ = auVar20;
    auVar21._1_12_ = SUB1512(auVar26 << 0x20,3);
    auVar21[0] = (char)(uVar3 >> 8);
    lVar31 = 0;
    do {
      auVar47 = pshuflw(ZEXT416((uint)left[lVar31] - (uint)left[-1]),
                        ZEXT416((uint)left[lVar31] - (uint)left[-1]),0);
      sVar54 = auVar47._0_2_;
      sVar46 = sVar54 + (ushort)(byte)uVar3;
      sVar55 = auVar47._2_2_;
      sVar49 = sVar55 + auVar21._0_2_;
      sVar50 = sVar54 + auVar20._0_2_;
      sVar51 = sVar55 + (short)Var19;
      sVar52 = sVar54 + auVar16._8_2_;
      sVar53 = sVar55 + auVar12._10_2_;
      sVar54 = sVar54 + auVar8._12_2_;
      sVar55 = sVar55 + (auVar5._13_2_ >> 8);
      *(ulong *)puVar32 =
           CONCAT17((0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55),
                    CONCAT16((0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54),
                             CONCAT15((0 < sVar53) * (sVar53 < 0x100) * (char)sVar53 -
                                      (0xff < sVar53),
                                      CONCAT14((0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 -
                                               (0xff < sVar52),
                                               CONCAT13((0 < sVar51) * (sVar51 < 0x100) *
                                                        (char)sVar51 - (0xff < sVar51),
                                                        CONCAT12((0 < sVar50) * (sVar50 < 0x100) *
                                                                 (char)sVar50 - (0xff < sVar50),
                                                                 CONCAT11((0 < sVar49) *
                                                                          (sVar49 < 0x100) *
                                                                          (char)sVar49 -
                                                                          (0xff < sVar49),
                                                                          (0 < sVar46) *
                                                                          (sVar46 < 0x100) *
                                                                          (char)sVar46 -
                                                                          (0xff < sVar46))))))));
      lVar31 = lVar31 + 1;
      puVar32 = puVar32 + 0x20;
    } while (lVar31 != 8);
  }
  puVar33 = (ulong *)(left + 0x10);
  if (left == (uint8_t *)0x0) {
    puVar33 = (ulong *)0x0;
  }
  puVar1 = (ulong *)(top + 8);
  if (top == (uint8_t *)0x0) {
    puVar1 = (ulong *)0x0;
    if (left == (uint8_t *)0x0) {
      lVar31 = 0;
      do {
        puVar32 = dst + lVar31 + 0x408;
        puVar32[0] = 0x80;
        puVar32[1] = 0x80;
        puVar32[2] = 0x80;
        puVar32[3] = 0x80;
        puVar32[4] = 0x80;
        puVar32[5] = 0x80;
        puVar32[6] = 0x80;
        puVar32[7] = 0x80;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
    else {
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *puVar33;
      auVar47 = psadbw((undefined1  [16])0x0,auVar40);
      uVar29 = auVar47._0_4_ + 4;
      uVar30 = uVar29 >> 3;
      bVar7 = (byte)(uVar29 >> 0x18);
      uVar45 = (undefined1)(uVar30 >> 0x10);
      uVar44 = (undefined1)(uVar30 >> 8);
      auVar41._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(bVar7 >> 3,bVar7 >> 3),uVar45),CONCAT14(uVar45,uVar30))
                >> 0x20);
      auVar41[3] = uVar44;
      auVar41[2] = uVar44;
      auVar41[0] = (undefined1)uVar30;
      auVar41[1] = auVar41[0];
      auVar41._8_8_ = 0;
      auVar47 = pshuflw(auVar41,auVar41,0);
      lVar31 = 0;
      do {
        *(long *)(dst + lVar31 + 0x408) = auVar47._0_8_;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
  }
  else if (left == (uint8_t *)0x0) {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *puVar1;
    auVar47 = psadbw((undefined1  [16])0x0,auVar42);
    uVar29 = auVar47._0_4_ + 4;
    uVar30 = uVar29 >> 3;
    bVar7 = (byte)(uVar29 >> 0x18);
    uVar45 = (undefined1)(uVar30 >> 0x10);
    uVar44 = (undefined1)(uVar30 >> 8);
    auVar43._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(bVar7 >> 3,bVar7 >> 3),uVar45),CONCAT14(uVar45,uVar30)) >>
              0x20);
    auVar43[3] = uVar44;
    auVar43[2] = uVar44;
    auVar43[0] = (undefined1)uVar30;
    auVar43[1] = auVar43[0];
    auVar43._8_8_ = 0;
    auVar47 = pshuflw(auVar43,auVar43,0);
    lVar31 = 0;
    do {
      *(long *)(dst + lVar31 + 0x408) = auVar47._0_8_;
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  else {
    auVar48._8_8_ = *puVar33;
    auVar48._0_8_ = *puVar1;
    auVar47 = psadbw((undefined1  [16])0x0,auVar48);
    uVar29 = auVar47._8_4_ + auVar47._0_4_ + 8;
    uVar30 = uVar29 >> 4;
    bVar7 = (byte)(uVar29 >> 0x18);
    uVar45 = (undefined1)(uVar30 >> 0x10);
    uVar44 = (undefined1)(uVar30 >> 8);
    auVar39._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(bVar7 >> 4,bVar7 >> 4),uVar45),CONCAT14(uVar45,uVar30)) >>
              0x20);
    auVar39[3] = uVar44;
    auVar39[2] = uVar44;
    auVar39[0] = (undefined1)uVar30;
    auVar39[1] = auVar39[0];
    auVar39._8_8_ = 0;
    auVar47 = pshuflw(auVar39,auVar39,0);
    lVar31 = 0;
    do {
      *(long *)(dst + lVar31 + 0x408) = auVar47._0_8_;
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  if (top == (uint8_t *)0x0) {
    lVar31 = 0;
    do {
      builtin_memcpy(dst + lVar31 + 0x508,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",8);
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  else {
    uVar3 = *puVar1;
    lVar31 = 0;
    do {
      *(ulong *)(dst + lVar31 + 0x508) = uVar3;
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  puVar32 = dst + 0x518;
  lVar31 = 0;
  if (left == (uint8_t *)0x0) {
    do {
      puVar2 = puVar32 + lVar31;
      puVar2[0] = 0x81;
      puVar2[1] = 0x81;
      puVar2[2] = 0x81;
      puVar2[3] = 0x81;
      puVar2[4] = 0x81;
      puVar2[5] = 0x81;
      puVar2[6] = 0x81;
      puVar2[7] = 0x81;
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  else {
    do {
      auVar47 = ZEXT216(CONCAT11(*(undefined1 *)((long)puVar33 + lVar31),
                                 *(undefined1 *)((long)puVar33 + lVar31)));
      auVar47 = pshuflw(auVar47,auVar47,0);
      *(long *)puVar32 = auVar47._0_8_;
      puVar32 = puVar32 + 0x20;
      lVar31 = lVar31 + 1;
    } while (lVar31 != 8);
  }
  puVar32 = dst + 0x418;
  if (left == (uint8_t *)0x0) {
    if (top == (uint8_t *)0x0) {
      lVar31 = 0;
      do {
        puVar2 = puVar32 + lVar31;
        puVar2[0] = 0x81;
        puVar2[1] = 0x81;
        puVar2[2] = 0x81;
        puVar2[3] = 0x81;
        puVar2[4] = 0x81;
        puVar2[5] = 0x81;
        puVar2[6] = 0x81;
        puVar2[7] = 0x81;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
    else {
      uVar3 = *puVar1;
      lVar31 = 0;
      do {
        *(ulong *)(puVar32 + lVar31) = uVar3;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
  }
  else if (top == (uint8_t *)0x0) {
    lVar31 = 0;
    do {
      auVar47 = ZEXT216(CONCAT11(*(undefined1 *)((long)puVar33 + lVar31),
                                 *(undefined1 *)((long)puVar33 + lVar31)));
      auVar47 = pshuflw(auVar47,auVar47,0);
      *(long *)puVar32 = auVar47._0_8_;
      puVar32 = puVar32 + 0x20;
      lVar31 = lVar31 + 1;
    } while (lVar31 != 8);
  }
  else {
    uVar3 = *puVar1;
    auVar6._8_6_ = 0;
    auVar6._0_8_ = uVar3;
    auVar6[0xe] = (char)(uVar3 >> 0x38);
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar3;
    auVar9[0xc] = (char)(uVar3 >> 0x30);
    auVar9._13_2_ = auVar6._13_2_;
    auVar11._8_4_ = 0;
    auVar11._0_8_ = uVar3;
    auVar11._12_3_ = auVar9._12_3_;
    auVar13._8_2_ = 0;
    auVar13._0_8_ = uVar3;
    auVar13[10] = (char)(uVar3 >> 0x28);
    auVar13._11_4_ = auVar11._11_4_;
    auVar15._8_2_ = 0;
    auVar15._0_8_ = uVar3;
    auVar15._10_5_ = auVar13._10_5_;
    auVar17[8] = (char)(uVar3 >> 0x20);
    auVar17._0_8_ = uVar3;
    auVar17._9_6_ = auVar15._9_6_;
    auVar22._7_8_ = 0;
    auVar22._0_7_ = auVar17._8_7_;
    Var19 = CONCAT81(SUB158(auVar22 << 0x40,7),(char)(uVar3 >> 0x18));
    auVar27._9_6_ = 0;
    auVar27._0_9_ = Var19;
    auVar23._1_10_ = SUB1510(auVar27 << 0x30,5);
    auVar23[0] = (char)(uVar3 >> 0x10);
    auVar28._11_4_ = 0;
    auVar28._0_11_ = auVar23;
    auVar24._1_12_ = SUB1512(auVar28 << 0x20,3);
    auVar24[0] = (char)(uVar3 >> 8);
    lVar31 = 0;
    do {
      auVar47 = ZEXT416((uint)*(byte *)((long)puVar33 + lVar31) -
                        (uint)*(byte *)((long)puVar33 + -1));
      auVar47 = pshuflw(auVar47,auVar47,0);
      sVar54 = auVar47._0_2_;
      sVar46 = sVar54 + (ushort)(byte)uVar3;
      sVar55 = auVar47._2_2_;
      sVar49 = sVar55 + auVar24._0_2_;
      sVar50 = sVar54 + auVar23._0_2_;
      sVar51 = sVar55 + (short)Var19;
      sVar52 = sVar54 + auVar17._8_2_;
      sVar53 = sVar55 + auVar13._10_2_;
      sVar54 = sVar54 + auVar9._12_2_;
      sVar55 = sVar55 + (auVar6._13_2_ >> 8);
      *(ulong *)puVar32 =
           CONCAT17((0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55),
                    CONCAT16((0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54),
                             CONCAT15((0 < sVar53) * (sVar53 < 0x100) * (char)sVar53 -
                                      (0xff < sVar53),
                                      CONCAT14((0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 -
                                               (0xff < sVar52),
                                               CONCAT13((0 < sVar51) * (sVar51 < 0x100) *
                                                        (char)sVar51 - (0xff < sVar51),
                                                        CONCAT12((0 < sVar50) * (sVar50 < 0x100) *
                                                                 (char)sVar50 - (0xff < sVar50),
                                                                 CONCAT11((0 < sVar49) *
                                                                          (sVar49 < 0x100) *
                                                                          (char)sVar49 -
                                                                          (0xff < sVar49),
                                                                          (0 < sVar46) *
                                                                          (sVar46 < 0x100) *
                                                                          (char)sVar46 -
                                                                          (0xff < sVar46))))))));
      lVar31 = lVar31 + 1;
      puVar32 = puVar32 + 0x20;
    } while (lVar31 != 8);
  }
  return;
}

Assistant:

static WEBP_INLINE void DC8uvMode_SSE2(uint8_t* dst, const uint8_t* left,
                                       const uint8_t* top) {
  if (top != NULL) {
    if (left != NULL) {  // top and left present
      DC8uv_SSE2(dst, left, top);
    } else {  // top, but no left
      DC8uvNoLeft_SSE2(dst, top);
    }
  } else if (left != NULL) {  // left but no top
    DC8uvNoTop_SSE2(dst, left);
  } else {  // no top, no left, nothing.
    DC8uvNoTopLeft_SSE2(dst);
  }
}